

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O2

bool __thiscall
libmatroska::KaxBlockGroup::AddFrame
          (KaxBlockGroup *this,KaxTrackEntry *track,uint64 timecode,DataBuffer *buffer,
          KaxBlockGroup *PastBlock,LacingType lacing)

{
  bool bVar1;
  KaxInternalBlock *this_00;
  KaxReferenceBlock *this_01;
  
  this_00 = &libebml::GetChild<libmatroska::KaxBlock>(&this->super_EbmlMaster)->
             super_KaxInternalBlock;
  if (this->ParentCluster != (KaxCluster *)0x0) {
    KaxInternalBlock::SetParent(this_00,this->ParentCluster);
    this->ParentTrack = track;
    bVar1 = KaxInternalBlock::AddFrame(this_00,track,timecode,buffer,lacing,false);
    this_01 = libebml::GetChild<libmatroska::KaxReferenceBlock>(&this->super_EbmlMaster);
    KaxReferenceBlock::SetReferencedBlock(this_01,PastBlock);
    this_01->ParentBlock = this;
    return bVar1;
  }
  __assert_fail("ParentCluster != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                ,0x2df,
                "bool libmatroska::KaxBlockGroup::AddFrame(const KaxTrackEntry &, uint64, DataBuffer &, const KaxBlockGroup &, LacingType)"
               );
}

Assistant:

bool KaxBlockGroup::AddFrame(const KaxTrackEntry & track, uint64 timecode, DataBuffer & buffer, const KaxBlockGroup & PastBlock, LacingType lacing)
{
  //  assert(past_timecode < 0);

  KaxBlock & theBlock = GetChild<KaxBlock>(*this);
  assert(ParentCluster != NULL);
  theBlock.SetParent(*ParentCluster);
  ParentTrack = &track;
  bool bRes = theBlock.AddFrame(track, timecode, buffer, lacing);

  KaxReferenceBlock & thePastRef = GetChild<KaxReferenceBlock>(*this);
  thePastRef.SetReferencedBlock(PastBlock);
  thePastRef.SetParentBlock(*this);

  return bRes;
}